

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void mwLimit(long lim)

{
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  mwWrite("limit: old limit = ");
  if (mwAllocLimit == 0) {
    mwWrite("none");
  }
  else {
    mwWrite("%ld bytes");
  }
  mwWrite(", new limit = ");
  if (lim == 0) {
    mwWrite("none\n");
  }
  else {
    mwWrite("%ld bytes\n",lim);
  }
  mwUseLimit = lim != 0;
  mwAllocLimit = lim;
  mwFlush();
  return;
}

Assistant:

void mwLimit(long lim)
{
	TESTS(NULL, 0);
	mwWrite("limit: old limit = ");
	if (!mwAllocLimit) {
		mwWrite("none");
	} else {
		mwWrite("%ld bytes", mwAllocLimit);
	}
	mwWrite(", new limit = ");
	if (!lim) {
		mwWrite("none\n");
		mwUseLimit = 0;
	} else {
		mwWrite("%ld bytes\n", lim);
		mwUseLimit = 1;
	}
	mwAllocLimit = lim;
	FLUSH();
}